

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O2

void EntityRelationTask::entity_first_decoding
               (search *sch,multi_ex *ec,v_array<unsigned_long> *predictions,bool isLdf)

{
  pointer ppeVar1;
  size_t sVar2;
  pointer ppeVar3;
  v_array<unsigned_long> *pvVar4;
  long lVar5;
  ulong uVar6;
  size_t i;
  v_array<unsigned_long> *pvVar7;
  double dVar8;
  undefined1 auVar9 [16];
  
  ppeVar1 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar3 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  lVar5 = (long)ppeVar3 + (1 - (long)ppeVar1);
  auVar9._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar9._0_8_ = lVar5;
  auVar9._12_4_ = 0x45300000;
  dVar8 = SQRT((auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) + -1.0;
  uVar6 = (ulong)dVar8;
  for (pvVar7 = (v_array<unsigned_long> *)0x0;
      pvVar4 = (v_array<unsigned_long> *)((long)ppeVar3 - (long)ppeVar1 >> 3), pvVar7 < pvVar4;
      pvVar7 = (v_array<unsigned_long> *)((long)&pvVar7->_begin + 1)) {
    if (pvVar7 < (v_array<unsigned_long> *)
                 (((long)(dVar8 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6) >> 1)) {
      sVar2 = predict_entity(sch,ppeVar1[(long)pvVar7],pvVar4,(ptag)pvVar7,isLdf);
    }
    else {
      sVar2 = predict_relation(sch,ppeVar1[(long)pvVar7],predictions,(ptag)pvVar7,isLdf);
    }
    predictions->_begin[(long)pvVar7] = sVar2;
    ppeVar1 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppeVar3 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  }
  return;
}

Assistant:

void entity_first_decoding(Search::search& sch, multi_ex& ec, v_array<size_t>& predictions, bool isLdf = false)
{
  // ec.size = #entity + #entity*(#entity-1)/2
  size_t n_ent = (size_t)(sqrt(ec.size() * 8 + 1) - 1) / 2;
  // Do entity recognition first
  for (size_t i = 0; i < ec.size(); i++)
  {
    if (i < n_ent)
      predictions[i] = predict_entity(sch, ec[i], predictions, (ptag)i, isLdf);
    else
      predictions[i] = predict_relation(sch, ec[i], predictions, (ptag)i, isLdf);
  }
}